

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

void ures_closeBundle(UResourceBundle *resB,UBool freeBundleObj)

{
  UBool UVar1;
  UBool freeBundleObj_local;
  UResourceBundle *resB_local;
  
  if (resB != (UResourceBundle *)0x0) {
    if (resB->fData != (UResourceDataEntry *)0x0) {
      entryClose(resB->fData);
    }
    if (resB->fVersion != (char *)0x0) {
      uprv_free_63(resB->fVersion);
    }
    ures_freeResPath(resB);
    UVar1 = ures_isStackObject(resB);
    if ((UVar1 == '\0') && (freeBundleObj != '\0')) {
      uprv_free_63(resB);
    }
  }
  return;
}

Assistant:

static void
ures_closeBundle(UResourceBundle* resB, UBool freeBundleObj)
{
    if(resB != NULL) {
        if(resB->fData != NULL) {
            entryClose(resB->fData);
        }
        if(resB->fVersion != NULL) {
            uprv_free(resB->fVersion);
        }
        ures_freeResPath(resB);

        if(ures_isStackObject(resB) == FALSE && freeBundleObj) {
            uprv_free(resB);
        }
#if 0 /*U_DEBUG*/
        else {
            /* poison the data */
            uprv_memset(resB, -1, sizeof(UResourceBundle));
        }
#endif
    }
}